

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O1

int Abc_NodeIsXor2(Abc_Obj_t *pNode)

{
  char *__s1;
  uint uVar1;
  int iVar2;
  
  if (pNode->pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                  ,0x3be,"int Abc_NodeIsXor2(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
    uVar1 = 0;
    if ((pNode->vFanins).nSize == 2) {
      if (pNode->pNtk->ntkFunc != ABC_FUNC_SOP) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                      ,0x3c4,"int Abc_NodeIsXor2(Abc_Obj_t *)");
      }
      __s1 = (char *)(pNode->field_5).pData;
      iVar2 = strcmp(__s1,"01 1\n10 1\n");
      if (iVar2 == 0) {
        uVar1 = 1;
      }
      else {
        iVar2 = strcmp(__s1,"10 1\n01 1\n");
        uVar1 = (uint)(iVar2 == 0);
      }
    }
    return uVar1;
  }
  __assert_fail("Abc_ObjIsNode(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/io/ioWriteBook.c"
                ,0x3bf,"int Abc_NodeIsXor2(Abc_Obj_t *)");
}

Assistant:

int Abc_NodeIsXor2( Abc_Obj_t * pNode )
{
    Abc_Ntk_t * pNtk = pNode->pNtk;
    assert( Abc_NtkIsNetlist(pNtk) );
    assert( Abc_ObjIsNode(pNode) ); 
    if ( Abc_ObjFaninNum(pNode) != 2 )
        return 0;
    if ( Abc_NtkHasSop(pNtk) )
	return ( !strcmp(((char *)pNode->pData), "01 1\n10 1\n") || !strcmp(((char *)pNode->pData), "10 1\n01 1\n")  );
    assert( 0 );
    return 0;
}